

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_108286::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::
push_back(accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_> *this,char c)

{
  ulong uVar1;
  char c_local;
  accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_> *this_local;
  
  if (this->width_ == 0) {
    std::__cxx11::wstring::operator+=((wstring *)&this->lines_,(wstring *)&this->indent_string_);
  }
  std::__cxx11::wstring::operator+=((wstring *)&this->lines_,(int)c);
  uVar1 = this->width_ + 1;
  this->width_ = uVar1;
  if (0x4f < uVar1) {
    std::__cxx11::wstring::operator+=((wstring *)&this->lines_,L'\n');
    this->width_ = 0;
    uVar1 = this->line_count_ + 1;
    this->line_count_ = uVar1;
    if (0x31 < uVar1) {
      std::operator<<(this->os_,(wstring *)&this->lines_);
      this->line_count_ = 0;
      std::__cxx11::wstring::clear();
      std::__cxx11::wstring::reserve((ulong)&this->lines_);
    }
  }
  return;
}

Assistant:

void accumulator<OStream>::push_back (char const c) {
        if (width_ == 0) {
            lines_ += indent_string_;
        }
        lines_ += c;
        if (++width_ >= line_width_) {
            lines_ += '\n';
            width_ = 0;
            if (++line_count_ >= lines_to_accumulate_) {
                os_ << lines_;
                line_count_ = 0;

                lines_.clear ();
                lines_.reserve (chars_to_reserve_);
            }
        }
    }